

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::SharedCtor(FileDescriptorProto *this)

{
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->package_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->options_ = (FileOptions *)0x0;
  this->source_code_info_ = (SourceCodeInfo *)0x0;
  return;
}

Assistant:

void FileDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  package_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  options_ = NULL;
  source_code_info_ = NULL;
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
}